

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<mock_arg_formatter,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>
               (mock_arg_formatter *vis,
               basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
               *arg)

{
  handle hVar1;
  basic_string_view<char> value;
  mock_arg_formatter *this;
  custom_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *in_RSI;
  mock_arg_formatter *in_RDI;
  mock_arg_formatter *in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff90;
  undefined2 in_stack_ffffffffffffff92;
  uint in_stack_ffffffffffffff94;
  bool value_00;
  undefined2 in_stack_ffffffffffffff98;
  undefined2 uVar2;
  undefined6 in_stack_ffffffffffffff9a;
  undefined6 uVar3;
  handle local_38;
  basic_string_view<char> local_28 [2];
  basic_buffer<char> *local_8;
  
  this = (mock_arg_formatter *)(ulong)*(uint *)&in_RSI[1].value;
  value_00 = SUB41(in_stack_ffffffffffffff94 >> 0x18,0);
  switch(this) {
  case (mock_arg_formatter *)0x0:
  default:
switchD_002560a8_default:
    local_8 = (basic_buffer<char> *)mock_arg_formatter::operator()(in_RDI);
    break;
  case (mock_arg_formatter *)0x1:
    goto switchD_002560a8_default;
  case (mock_arg_formatter *)0x2:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        ((mock_arg_formatter *)
                         CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94);
    break;
  case (mock_arg_formatter *)0x3:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        ((mock_arg_formatter *)
                         CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                         in_stack_ffffffffffffff94);
    break;
  case (mock_arg_formatter *)0x4:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        ((mock_arg_formatter *)
                         CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                         CONCAT44(in_stack_ffffffffffffff94,
                                  CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
    break;
  case (mock_arg_formatter *)0x5:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        ((mock_arg_formatter *)
                         CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),
                         CONCAT44(in_stack_ffffffffffffff94,
                                  CONCAT22(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90)));
    break;
  case (mock_arg_formatter *)0x6:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        ((mock_arg_formatter *)
                         CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),value_00);
    break;
  case (mock_arg_formatter *)0x7:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        ((mock_arg_formatter *)
                         CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),value_00);
    break;
  case (mock_arg_formatter *)0x8:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()(in_stack_ffffffffffffff88,1.21035411413155e-317);
    break;
  case (mock_arg_formatter *)0x9:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        (this,(longdouble)
                              CONCAT28(in_stack_ffffffffffffff98,
                                       CONCAT44(in_stack_ffffffffffffff94,
                                                CONCAT22(in_stack_ffffffffffffff92,
                                                         (short)((unkuint10)*(unkbyte10 *)in_RSI >>
                                                                0x40)))));
    break;
  case (mock_arg_formatter *)0xa:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()(in_stack_ffffffffffffff88,(char *)0x2561b4);
    break;
  case (mock_arg_formatter *)0xb:
    basic_string_view<char>::basic_string_view
              (local_28,(char *)in_RSI->value,(size_t)in_RSI->format);
    value.size_ = (size_t)this;
    value.data_ = (char *)in_RDI;
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()
                        ((mock_arg_formatter *)
                         CONCAT62(in_stack_ffffffffffffff9a,in_stack_ffffffffffffff98),value);
    break;
  case (mock_arg_formatter *)0xc:
    local_8 = (basic_buffer<char> *)
              mock_arg_formatter::operator()(in_stack_ffffffffffffff88,(void *)0x256210);
    break;
  case (mock_arg_formatter *)0xd:
    uVar2 = SUB82(in_RDI,0);
    uVar3 = (undefined6)((ulong)in_RDI >> 0x10);
    basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::handle::handle(&local_38,*in_RSI);
    hVar1.custom_.value._2_2_ = in_stack_ffffffffffffff92;
    hVar1.custom_.value._0_2_ = in_stack_ffffffffffffff90;
    hVar1.custom_.value._4_4_ = in_stack_ffffffffffffff94;
    hVar1.custom_.format._0_2_ = uVar2;
    hVar1.custom_.format._2_6_ = uVar3;
    local_8 = (basic_buffer<char> *)mock_arg_formatter::operator()(in_stack_ffffffffffffff88,hVar1);
  }
  return (type)local_8;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}